

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

bool __thiscall pbrt::SquareMatrix<3>::operator!=(SquareMatrix<3> *this,SquareMatrix<3> *m2)

{
  float fVar1;
  float fVar2;
  int i;
  ulong uVar3;
  int j;
  long lVar4;
  
  for (uVar3 = 0; uVar3 != 3; uVar3 = uVar3 + 1) {
    lVar4 = 0;
    while (lVar4 != 3) {
      fVar1 = (*(Float (*) [3])*(Float (*) [3])this)[lVar4];
      fVar2 = (*(Float (*) [3])*(Float (*) [3])m2)[lVar4];
      lVar4 = lVar4 + 1;
      if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) goto LAB_003117bd;
    }
    this = (SquareMatrix<3> *)((long)this + 0xc);
    m2 = (SquareMatrix<3> *)((long)m2 + 0xc);
  }
LAB_003117bd:
  return uVar3 < 3;
}

Assistant:

PBRT_CPU_GPU
    bool operator!=(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                if (m[i][j] != m2.m[i][j])
                    return true;
        return false;
    }